

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O2

blargg_err_t __thiscall Fir_Resampler_::buffer_size(Fir_Resampler_ *this,int new_size)

{
  blargg_err_t pcVar1;
  
  pcVar1 = blargg_vector<short>::resize(&this->buf,(long)new_size + (long)this->write_offset);
  if (pcVar1 == (blargg_err_t)0x0) {
    clear(this);
  }
  return pcVar1;
}

Assistant:

blargg_err_t Fir_Resampler_::buffer_size( int new_size )
{
	RETURN_ERR( buf.resize( new_size + write_offset ) );
	clear();
	return 0;
}